

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixgbe.cpp
# Opt level: O1

void __thiscall ixy::IxgbeDevice::read_stats(IxgbeDevice *this,device_stats *stats)

{
  if ((((0x4073 < this->len - 4) &&
       (stats->rx_pkts = stats->rx_pkts + (ulong)*(uint *)(this->addr + 0x4074),
       0x407f < this->len - 4)) &&
      (stats->tx_pkts = stats->tx_pkts + (ulong)*(uint *)(this->addr + 0x4080),
      0x4087 < this->len - 4)) &&
     (((0x408b < this->len - 4 &&
       (stats->rx_bytes =
             stats->rx_bytes +
             CONCAT44(*(undefined4 *)(this->addr + 0x408c),*(undefined4 *)(this->addr + 0x4088)),
       0x408f < this->len - 4)) && (0x4093 < this->len - 4)))) {
    stats->tx_bytes =
         stats->tx_bytes +
         CONCAT44(*(undefined4 *)(this->addr + 0x4094),*(undefined4 *)(this->addr + 0x4090));
    return;
  }
  __assert_fail("reg <= len - 4",
                "/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/ixgbe.cpp"
                ,0x1cb,"uint32_t ixy::IxgbeDevice::get_reg32(uint64_t)");
}

Assistant:

void IxgbeDevice::read_stats(struct device_stats &stats) {
    stats.dev = *this;
    stats.rx_pkts += get_reg32(IXGBE_GPRC);
    stats.tx_pkts += get_reg32(IXGBE_GPTC);
    stats.rx_bytes += get_reg32(IXGBE_GORCL) + ((static_cast<uint64_t>(get_reg32(IXGBE_GORCH))) << 32u);
    stats.tx_bytes += get_reg32(IXGBE_GOTCL) + ((static_cast<uint64_t>(get_reg32(IXGBE_GOTCH))) << 32u);
}